

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setFlagOption
          (CommonCore *this,LocalFederateId federateID,int32_t flag,bool flagValue)

{
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  ActionMessage cmd;
  
  if ((flag & 0xfffffffeU) == 0x58) {
    ActionMessage::ActionMessage(&cmd,cmd_base_configure);
    if (flagValue) {
      cmd.flags._0_1_ = (byte)cmd.flags | 0x20;
    }
    cmd.messageID = flag;
    BrokerBase::addActionMessage(&this->super_BrokerBase,&cmd);
    ActionMessage::~ActionMessage(&cmd);
  }
  if (federateID.fid == -0x103) {
    if (flag == 0x114) {
      LogBuffer::enable(&((this->super_BrokerBase).mLogManager.
                          super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->mLogBuffer,flagValue);
      return;
    }
    if (flag == 0x2d) {
      if (flagValue) {
        LOCK();
        (this->delayInitCounter).super___atomic_base<short>._M_i =
             (this->delayInitCounter).super___atomic_base<short>._M_i + 1;
        UNLOCK();
        return;
      }
      ActionMessage::ActionMessage(&cmd,cmd_core_configure);
      cmd.messageID = 0x2d;
      BrokerBase::addActionMessage(&this->super_BrokerBase,&cmd);
    }
    else {
      ActionMessage::ActionMessage(&cmd,cmd_core_configure);
      if (flagValue) {
        cmd.flags._0_1_ = (byte)cmd.flags | 0x20;
      }
      cmd.messageID = flag;
      BrokerBase::addActionMessage(&this->super_BrokerBase,&cmd);
    }
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "federateID not valid (setFlag)";
      message._M_len = 0x1e;
      InvalidIdentifier::InvalidIdentifier(this_01,message);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    ActionMessage::ActionMessage(&cmd,cmd_fed_configure_flag);
    if (flagValue) {
      cmd.flags._0_1_ = (byte)cmd.flags | 0x20;
    }
    cmd.messageID = flag;
    FederateState::setProperties(this_00,&cmd);
  }
  ActionMessage::~ActionMessage(&cmd);
  return;
}

Assistant:

void CommonCore::setFlagOption(LocalFederateId federateID, int32_t flag, bool flagValue)
{
    if (flag == defs::Flags::DUMPLOG || flag == defs::Flags::FORCE_LOGGING_FLUSH) {
        ActionMessage cmd(CMD_BASE_CONFIGURE);
        cmd.messageID = flag;
        if (flagValue) {
            setActionFlag(cmd, indicator_flag);
        }
        addActionMessage(cmd);
    }
    if (federateID == gLocalCoreId) {
        switch (flag) {
            case defs::Flags::DELAY_INIT_ENTRY:
                if (flagValue) {
                    ++delayInitCounter;
                } else {
                    ActionMessage cmd(CMD_CORE_CONFIGURE);
                    cmd.messageID = defs::Flags::DELAY_INIT_ENTRY;
                    addActionMessage(cmd);
                }
                break;
            case defs::LOG_BUFFER:
                mLogManager->getLogBuffer().enable(flagValue);
                break;
            default: {
                ActionMessage cmd(CMD_CORE_CONFIGURE);
                cmd.messageID = flag;
                if (flagValue) {
                    setActionFlag(cmd, indicator_flag);
                }
                addActionMessage(cmd);
            } break;
        }
        return;
    }

    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setFlag)"));
    }
    ActionMessage cmd(CMD_FED_CONFIGURE_FLAG);
    cmd.messageID = flag;
    if (flagValue) {
        setActionFlag(cmd, indicator_flag);
    }
    fed->setProperties(cmd);
}